

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::InternReadFile
          (X3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  _List_node_base *p_Var1;
  CX3DImporter_NodeElement *pCVar2;
  long lVar3;
  aiNode *this_00;
  CX3DImporter_NodeElement *pNodeElement;
  aiMesh **ppaVar4;
  ulong uVar5;
  aiMaterial **ppaVar6;
  aiLight **ppaVar7;
  uint uVar8;
  const_iterator it;
  _List_node_base *p_Var9;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> mesh_list;
  list<aiLight_*,_std::allocator<aiLight_*>_> light_list;
  list<aiMaterial_*,_std::allocator<aiMaterial_*>_> mat_list;
  _List_node_base local_80;
  _List_node_base local_70;
  _List_node_base local_60;
  ulong local_50;
  _List_node_base local_48;
  ulong local_38;
  
  this->mpIOHandler = pIOHandler;
  Clear(this);
  lVar3 = std::__cxx11::string::find_last_of((char *)pFile,0x750d46,0xffffffffffffffff);
  if (lVar3 == -1) {
    local_80._M_next = &local_70;
    local_80._M_prev = (_List_node_base *)0x0;
    local_70._M_next = (_List_node_base *)((ulong)local_70._M_next & 0xffffffffffffff00);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_80,(ulong)pFile);
  }
  (*pIOHandler->_vptr_IOSystem[7])(pIOHandler,&local_80);
  if (local_80._M_next != &local_70) {
    operator_delete(local_80._M_next);
  }
  ParseFile(this,pFile,pIOHandler);
  (*pIOHandler->_vptr_IOSystem[10])(pIOHandler);
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pScene->mRootNode = this_00;
  this_00->mParent = (aiNode *)0x0;
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 0x20;
  pCVar2 = (CX3DImporter_NodeElement *)
           (this->NodeElement_List).
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  do {
    pNodeElement = pCVar2;
    this->NodeElement_Cur = pNodeElement;
    pCVar2 = pNodeElement->Parent;
  } while (pNodeElement->Parent != (CX3DImporter_NodeElement *)0x0);
  local_70._M_next = (_List_node_base *)0x0;
  local_38 = 0;
  local_50 = 0;
  local_80._M_next = &local_80;
  local_80._M_prev = &local_80;
  local_60._M_next = &local_60;
  local_60._M_prev = &local_60;
  local_48._M_next = &local_48;
  local_48._M_prev = &local_48;
  Postprocess_BuildNode
            (this,pNodeElement,pScene->mRootNode,
             (list<aiMesh_*,_std::allocator<aiMesh_*>_> *)&local_80,
             (list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&local_48,
             (list<aiLight_*,_std::allocator<aiLight_*>_> *)&local_60);
  p_Var9 = local_80._M_next;
  if (local_80._M_next != &local_80) {
    uVar8 = (uint)local_70._M_next;
    pScene->mNumMeshes = uVar8;
    ppaVar4 = (aiMesh **)operator_new__(((ulong)local_70._M_next & 0xffffffff) << 3);
    pScene->mMeshes = ppaVar4;
    if (uVar8 != 0) {
      uVar5 = 0;
      do {
        p_Var1 = p_Var9 + 1;
        p_Var9 = p_Var9->_M_next;
        pScene->mMeshes[uVar5] = (aiMesh *)p_Var1->_M_next;
        uVar5 = uVar5 + 1;
      } while (uVar5 < pScene->mNumMeshes);
    }
  }
  p_Var9 = local_48._M_next;
  if (local_48._M_next != &local_48) {
    uVar8 = (uint)local_38;
    pScene->mNumMaterials = uVar8;
    ppaVar6 = (aiMaterial **)operator_new__((local_38 & 0xffffffff) << 3);
    pScene->mMaterials = ppaVar6;
    if (uVar8 != 0) {
      uVar5 = 0;
      do {
        p_Var1 = p_Var9 + 1;
        p_Var9 = p_Var9->_M_next;
        pScene->mMaterials[uVar5] = (aiMaterial *)p_Var1->_M_next;
        uVar5 = uVar5 + 1;
      } while (uVar5 < pScene->mNumMaterials);
    }
  }
  p_Var9 = local_60._M_next;
  p_Var1 = p_Var9;
  if (local_60._M_next != &local_60) {
    uVar8 = (uint)local_50;
    pScene->mNumLights = uVar8;
    ppaVar7 = (aiLight **)operator_new__((local_50 & 0xffffffff) << 3);
    pScene->mLights = ppaVar7;
    if (uVar8 != 0) {
      uVar5 = 0;
      do {
        p_Var1 = p_Var9 + 1;
        p_Var9 = p_Var9->_M_next;
        pScene->mLights[uVar5] = (aiLight *)p_Var1->_M_next;
        uVar5 = uVar5 + 1;
        p_Var1 = local_60._M_next;
      } while (uVar5 < pScene->mNumLights);
    }
  }
  while (p_Var9 = local_48._M_next, p_Var1 != &local_60) {
    p_Var9 = (((_List_base<aiLight_*,_std::allocator<aiLight_*>_> *)&p_Var1->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var1);
    p_Var1 = p_Var9;
  }
  while (p_Var1 = local_80._M_next, p_Var9 != &local_48) {
    p_Var1 = (((_List_base<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&p_Var9->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    operator_delete(p_Var9);
    p_Var9 = p_Var1;
  }
  while (p_Var1 != &local_80) {
    p_Var9 = (((_List_base<aiMesh_*,_std::allocator<aiMesh_*>_> *)&p_Var1->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var1);
    p_Var1 = p_Var9;
  }
  return;
}

Assistant:

void X3DImporter::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
	mpIOHandler = pIOHandler;

	Clear();// delete old graph.
	std::string::size_type slashPos = pFile.find_last_of("\\/");
	pIOHandler->PushDirectory(slashPos == std::string::npos ? std::string() : pFile.substr(0, slashPos + 1));
	ParseFile(pFile, pIOHandler);
	pIOHandler->PopDirectory();
	//
	// Assimp use static arrays of objects for fast speed of rendering. That's good, but need some additional operations/
	// We know that geometry objects(meshes) are stored in <Shape>, also in <Shape>-><Appearance> materials(in Assimp logical view)
	// are stored. So at first we need to count how meshes and materials are stored in scene graph.
	//
	// at first creating root node for aiScene.
	pScene->mRootNode = new aiNode;
	pScene->mRootNode->mParent = nullptr;
	pScene->mFlags |= AI_SCENE_FLAGS_ALLOW_SHARED;
	//search for root node element
	NodeElement_Cur = NodeElement_List.front();
	while(NodeElement_Cur->Parent != nullptr) NodeElement_Cur = NodeElement_Cur->Parent;

	{// fill aiScene with objects.
		std::list<aiMesh*> mesh_list;
		std::list<aiMaterial*> mat_list;
		std::list<aiLight*> light_list;

		// create nodes tree
		Postprocess_BuildNode(*NodeElement_Cur, *pScene->mRootNode, mesh_list, mat_list, light_list);
		// copy needed data to scene
		if(!mesh_list.empty())
		{
			std::list<aiMesh*>::const_iterator it = mesh_list.begin();

			pScene->mNumMeshes = static_cast<unsigned int>(mesh_list.size());
			pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
			for(size_t i = 0; i < pScene->mNumMeshes; i++) pScene->mMeshes[i] = *it++;
		}

		if(!mat_list.empty())
		{
			std::list<aiMaterial*>::const_iterator it = mat_list.begin();

			pScene->mNumMaterials = static_cast<unsigned int>(mat_list.size());
			pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
			for(size_t i = 0; i < pScene->mNumMaterials; i++) pScene->mMaterials[i] = *it++;
		}

		if(!light_list.empty())
		{
			std::list<aiLight*>::const_iterator it = light_list.begin();

			pScene->mNumLights = static_cast<unsigned int>(light_list.size());
			pScene->mLights = new aiLight*[pScene->mNumLights];
			for(size_t i = 0; i < pScene->mNumLights; i++) pScene->mLights[i] = *it++;
		}
	}// END: fill aiScene with objects.

	///TODO: IME optimize tree
}